

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

void ssl_swap_epochs(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  mbedtls_ssl_transform *pmVar2;
  undefined8 uVar3;
  uchar *puVar4;
  
  pmVar1 = ssl->handshake;
  pmVar2 = ssl->transform_out;
  if (pmVar2 != pmVar1->alt_transform_out) {
    ssl->transform_out = pmVar1->alt_transform_out;
    pmVar1->alt_transform_out = pmVar2;
    uVar3 = *(undefined8 *)ssl->out_ctr;
    *(undefined8 *)ssl->out_ctr = *(undefined8 *)pmVar1->alt_out_ctr;
    *(undefined8 *)ssl->handshake->alt_out_ctr = uVar3;
    pmVar2 = ssl->transform_out;
    if ((pmVar2 == (mbedtls_ssl_transform *)0x0) || (ssl->minor_ver < 2)) {
      puVar4 = ssl->out_iv;
    }
    else {
      puVar4 = ssl->out_iv + (pmVar2->ivlen - pmVar2->fixed_ivlen);
    }
    ssl->out_msg = puVar4;
  }
  return;
}

Assistant:

static void ssl_swap_epochs( mbedtls_ssl_context *ssl )
{
    mbedtls_ssl_transform *tmp_transform;
    unsigned char tmp_out_ctr[8];

    if( ssl->transform_out == ssl->handshake->alt_transform_out )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "skip swap epochs" ) );
        return;
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "swap epochs" ) );

    /* Swap transforms */
    tmp_transform                     = ssl->transform_out;
    ssl->transform_out                = ssl->handshake->alt_transform_out;
    ssl->handshake->alt_transform_out = tmp_transform;

    /* Swap epoch + sequence_number */
    memcpy( tmp_out_ctr,                 ssl->out_ctr,                8 );
    memcpy( ssl->out_ctr,                ssl->handshake->alt_out_ctr, 8 );
    memcpy( ssl->handshake->alt_out_ctr, tmp_out_ctr,                 8 );

    /* Adjust to the newly activated transform */
    if( ssl->transform_out != NULL &&
        ssl->minor_ver >= MBEDTLS_SSL_MINOR_VERSION_2 )
    {
        ssl->out_msg = ssl->out_iv + ssl->transform_out->ivlen -
                                     ssl->transform_out->fixed_ivlen;
    }
    else
        ssl->out_msg = ssl->out_iv;

#if defined(MBEDTLS_SSL_HW_RECORD_ACCEL)
    if( mbedtls_ssl_hw_record_activate != NULL )
    {
        if( ( ret = mbedtls_ssl_hw_record_activate( ssl, MBEDTLS_SSL_CHANNEL_OUTBOUND ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_hw_record_activate", ret );
            return( MBEDTLS_ERR_SSL_HW_ACCEL_FAILED );
        }
    }
#endif
}